

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_deposit_i32_aarch64
               (TCGContext_conflict1 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2,uint ofs,
               uint len)

{
  int arg2_00;
  TCGv_i32 ret_00;
  TCGv_i32 t1;
  uint32_t mask;
  uint len_local;
  uint ofs_local;
  TCGv_i32 arg2_local;
  TCGv_i32 arg1_local;
  TCGv_i32 ret_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (len == 0x20) {
    tcg_gen_mov_i32(tcg_ctx,ret,arg2);
  }
  else if ((((ofs == 0) && (len == 8)) || ((ofs == 8 && (len == 8)))) ||
          ((ofs == 0 && (len == 0x10)))) {
    tcg_gen_op5ii_i32(tcg_ctx,INDEX_op_deposit_i32,ret,arg1,arg2,(ulong)ofs,(ulong)len);
  }
  else {
    ret_00 = tcg_temp_new_i32(tcg_ctx);
    if (ofs + len == 0x20) {
      tcg_gen_shli_i32_aarch64(tcg_ctx,ret_00,arg1,len);
      tcg_gen_extract2_i32_aarch64(tcg_ctx,ret,ret_00,arg2,len);
    }
    else if (ofs == 0) {
      tcg_gen_extract2_i32_aarch64(tcg_ctx,ret,arg1,arg2,len);
      tcg_gen_rotli_i32_aarch64(tcg_ctx,ret,ret,len);
    }
    else {
      arg2_00 = (1 << ((byte)len & 0x1f)) + -1;
      if (ofs + len < 0x20) {
        tcg_gen_andi_i32_aarch64(tcg_ctx,ret_00,arg2,arg2_00);
        tcg_gen_shli_i32_aarch64(tcg_ctx,ret_00,ret_00,ofs);
      }
      else {
        tcg_gen_shli_i32_aarch64(tcg_ctx,ret_00,arg2,ofs);
      }
      tcg_gen_andi_i32_aarch64(tcg_ctx,ret,arg1,arg2_00 << ((byte)ofs & 0x1f) ^ 0xffffffff);
      tcg_gen_or_i32(tcg_ctx,ret,ret,ret_00);
    }
    tcg_temp_free_i32(tcg_ctx,ret_00);
  }
  return;
}

Assistant:

void tcg_gen_deposit_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2,
                         unsigned int ofs, unsigned int len)
{
    uint32_t mask;
    TCGv_i32 t1;

    tcg_debug_assert(ofs < 32);
    tcg_debug_assert(len > 0);
    tcg_debug_assert(len <= 32);
    tcg_debug_assert(ofs + len <= 32);

    if (len == 32) {
        tcg_gen_mov_i32(tcg_ctx, ret, arg2);
        return;
    }
    if (TCG_TARGET_HAS_deposit_i32 && TCG_TARGET_deposit_i32_valid(ofs, len)) {
        tcg_gen_op5ii_i32(tcg_ctx, INDEX_op_deposit_i32, ret, arg1, arg2, ofs, len);
        return;
    }

    t1 = tcg_temp_new_i32(tcg_ctx);

    if (TCG_TARGET_HAS_extract2_i32) {
        if (ofs + len == 32) {
            tcg_gen_shli_i32(tcg_ctx, t1, arg1, len);
            tcg_gen_extract2_i32(tcg_ctx, ret, t1, arg2, len);
            goto done;
        }
        if (ofs == 0) {
            tcg_gen_extract2_i32(tcg_ctx, ret, arg1, arg2, len);
            tcg_gen_rotli_i32(tcg_ctx, ret, ret, len);
            goto done;
        }
    }

    mask = (1u << len) - 1;
    if (ofs + len < 32) {
        tcg_gen_andi_i32(tcg_ctx, t1, arg2, mask);
        tcg_gen_shli_i32(tcg_ctx, t1, t1, ofs);
    } else {
        tcg_gen_shli_i32(tcg_ctx, t1, arg2, ofs);
    }
    tcg_gen_andi_i32(tcg_ctx, ret, arg1, ~(mask << ofs));
    tcg_gen_or_i32(tcg_ctx, ret, ret, t1);
 done:
    tcg_temp_free_i32(tcg_ctx, t1);
}